

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_game.hpp
# Opt level: O0

void __thiscall PatchNewGame::alter_rom(PatchNewGame *this,ROM *rom)

{
  ROM *pRVar1;
  Code *pCVar2;
  Code local_1a8;
  Code local_128;
  Code local_98;
  ROM *local_18;
  ROM *rom_local;
  PatchNewGame *this_local;
  
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl._0_8_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl._0_8_ = 0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_18 = rom;
  rom_local = (ROM *)this;
  md::Code::Code(&local_98);
  pCVar2 = md::Code::nop(&local_98,4);
  md::ROM::set_code(rom,0x281a,pCVar2);
  md::Code::~Code(&local_98);
  pRVar1 = local_18;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._labels._M_t._M_impl._0_8_ = 0;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_128._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_128._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._pending_branches._M_t._M_impl._0_8_ = 0;
  local_128._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md::Code::Code(&local_128);
  pCVar2 = md::Code::nop(&local_128,5);
  md::ROM::set_code(pRVar1,0x8dda,pCVar2);
  md::Code::~Code(&local_128);
  pRVar1 = local_18;
  local_1a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_1a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_1a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a8._labels._M_t._M_impl._0_8_ = 0;
  local_1a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_1a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_1a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._pending_branches._M_t._M_impl._0_8_ = 0;
  local_1a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md::Code::Code(&local_1a8);
  pCVar2 = md::Code::nop(&local_1a8,4);
  md::ROM::set_code(pRVar1,0x8f6e,pCVar2);
  md::Code::~Code(&local_1a8);
  md::ROM::set_byte(local_18,0x8f76,'`');
  return;
}

Assistant:

void alter_rom(md::ROM& rom) override
    {
        // Usually, when starting a new game, it is automatically put into "cutscene mode" to
        // let the intro roll without allowing the player to move or pause, or do anything at all.
        // We need to remove that cutscene flag to enable the player actually playing the game.
        rom.set_code(0x281A, md::Code().nop(4));

        // Loading a save inside the map having the intro ID triggers the intro. That's not the kind
        // of behavior we want.
        rom.set_code(0x8DDA, md::Code().nop(5));

        // Load HUD tiles properly when loading inside intro map
        rom.set_code(0x8F6E, md::Code().nop(4));
        rom.set_byte(0x8F76, 0x60);
    }